

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

void __thiscall
tcu::PixelBufferAccess::PixelBufferAccess
          (PixelBufferAccess *this,TextureFormat *format,int width,int height,int depth,void *data)

{
  (this->super_ConstPixelBufferAccess).m_format = *format;
  (this->super_ConstPixelBufferAccess).m_size.m_data[0] = width;
  (this->super_ConstPixelBufferAccess).m_size.m_data[1] = height;
  (this->super_ConstPixelBufferAccess).m_size.m_data[2] = depth;
  calculatePackedPitch
            ((tcu *)&(this->super_ConstPixelBufferAccess).m_pitch,(TextureFormat *)this,
             &(this->super_ConstPixelBufferAccess).m_size);
  (this->super_ConstPixelBufferAccess).m_data = data;
  return;
}

Assistant:

PixelBufferAccess::PixelBufferAccess (const TextureFormat& format, int width, int height, int depth, void* data)
	: ConstPixelBufferAccess(format, width, height, depth, data)
{
}